

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall ObjectTest_basic_has_vector_Test::TestBody(ObjectTest_basic_has_vector_Test *this)

{
  object obj;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_48;
  undefined1 local_18;
  
  local_48._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
  local_18 = 0;
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_48._M_first);
  return;
}

Assistant:

TEST(ObjectTest, basic_has_vector) {
	object obj;

	EXPECT_FALSE(obj.has<std::vector<bool>>());
	EXPECT_FALSE(obj.has<std::vector<signed char>>());
	EXPECT_FALSE(obj.has<std::vector<unsigned char>>());
	EXPECT_FALSE(obj.has<std::vector<short>>());
	EXPECT_FALSE(obj.has<std::vector<int>>());
	EXPECT_FALSE(obj.has<std::vector<long>>());
	EXPECT_FALSE(obj.has<std::vector<long long>>());
	EXPECT_FALSE(obj.has<std::vector<intmax_t>>());
	EXPECT_FALSE(obj.has<std::vector<float>>());
	EXPECT_FALSE(obj.has<std::vector<double>>());
	EXPECT_FALSE(obj.has<std::vector<long double>>());
	EXPECT_FALSE(obj.has<std::vector<std::u8string>>());
	EXPECT_FALSE(obj.has<std::vector<object>>());
}